

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  NonCopyable *in_RDI;
  undefined1 auVar5 [12];
  exception *ex;
  exception_ptr *ex_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *__range2;
  Colour colourGuard;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *exceptions;
  ConfigData *in_stack_000026d8;
  undefined4 in_stack_fffffffffffffe08;
  Code in_stack_fffffffffffffe0c;
  ConfigData *in_stack_fffffffffffffe10;
  Parser *in_stack_fffffffffffffe20;
  ConfigData *in_stack_fffffffffffffe50;
  undefined1 local_a0 [8];
  reference local_98;
  exception_ptr *local_90;
  __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
  local_88;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *local_80;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *local_70;
  SourceLineInfo local_68 [2];
  string local_48 [32];
  logic_error local_28 [20];
  undefined4 local_14;
  undefined8 local_10;
  
  NonCopyable::NonCopyable(in_RDI);
  in_RDI->_vptr_NonCopyable = (_func_int **)&PTR__Session_002643c8;
  clara::detail::Parser::Parser(in_stack_fffffffffffffe20);
  ConfigData::ConfigData(in_stack_fffffffffffffe50);
  clara::std::shared_ptr<Catch::Config>::shared_ptr((shared_ptr<Catch::Config> *)0x12905d);
  *(undefined1 *)&in_RDI[0x2b]._vptr_NonCopyable = 0;
  if ((Session::alreadyInstantiated & 1U) != 0) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffe10);
    SourceLineInfo::SourceLineInfo
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/../external/catch.hpp"
               ,0x2ae9);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffe10,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffe10,
               (char (*) [25])CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffe10,
               (char (*) [53])CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
              );
    std::logic_error::logic_error(local_28,local_48);
    throw_exception<std::logic_error>((logic_error *)in_stack_fffffffffffffe10);
  }
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[6])();
  local_70 = StartupExceptionRegistry::getExceptions
                       ((StartupExceptionRegistry *)CONCAT44(extraout_var,iVar2));
  bVar1 = clara::std::
          vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
          ::empty((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                   *)in_stack_fffffffffffffe20);
  if (!bVar1) {
    *(undefined1 *)&in_RDI[0x2b]._vptr_NonCopyable = 1;
    Colour::Colour((Colour *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    poVar4 = cerr();
    poVar4 = std::operator<<(poVar4,"Errors occurred during startup!");
    std::operator<<(poVar4,'\n');
    local_80 = local_70;
    local_88._M_current =
         (exception_ptr *)
         clara::std::
         vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
         ::begin((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                  *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_90 = (exception_ptr *)
               clara::std::
               vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
               ::end((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    if (bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                 ::operator*(&local_88);
      clara::std::__exception_ptr::exception_ptr::exception_ptr
                ((exception_ptr *)in_stack_fffffffffffffe10,
                 (exception_ptr *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      auVar5 = std::rethrow_exception((exception_ptr)local_a0);
      local_14 = auVar5._8_4_;
      local_10 = auVar5._0_8_;
      Colour::~Colour((Colour *)0x129561);
      clara::std::shared_ptr<Catch::Config>::~shared_ptr((shared_ptr<Catch::Config> *)0x1295bd);
      ConfigData::~ConfigData(in_stack_fffffffffffffe10);
      clara::detail::Parser::~Parser((Parser *)in_stack_fffffffffffffe10);
      NonCopyable::~NonCopyable(in_RDI);
      _Unwind_Resume(local_10);
    }
    Colour::~Colour((Colour *)0x129552);
  }
  Session::alreadyInstantiated = true;
  makeCommandLineParser(in_stack_000026d8);
  clara::detail::Parser::operator=
            ((Parser *)in_stack_fffffffffffffe10,
             (Parser *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  clara::detail::Parser::~Parser((Parser *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }